

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotStairsEx<ImPlot::GetterXsYs<double>>(char *label_id,GetterXsYs<double> *getter)

{
  double dVar1;
  ImVec2 IVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  TransformerLogLog transformer;
  ImPlotPlot *pIVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  ImPlotRange *pIVar12;
  bool bVar13;
  ImU32 col;
  long lVar14;
  ImPlotContext *pIVar15;
  double *pdVar16;
  double *pdVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  float fVar23;
  double dVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 local_a0;
  ImU32 local_98;
  ImU32 local_94;
  ImDrawList *local_90;
  uint local_88;
  uint local_84;
  undefined8 local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  double *local_58;
  double *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  bVar13 = BeginItem(label_id,0);
  pIVar15 = GImPlot;
  if (bVar13) {
    if ((GImPlot->FitThisFrame == true) && (iVar3 = getter->Count, 0 < iVar3)) {
      pdVar16 = getter->Xs;
      pdVar17 = getter->Ys;
      iVar4 = getter->Offset;
      iVar18 = getter->Stride;
      pIVar8 = GImPlot->CurrentPlot;
      iVar5 = pIVar8->CurrentYAxis;
      uVar6 = (pIVar8->XAxis).Flags;
      pIVar12 = GImPlot->ExtentsY;
      uVar7 = pIVar8->YAxis[iVar5].Flags;
      iVar19 = 0;
      local_80 = (ImPlotContext *)(CONCAT44(local_80._4_4_,uVar7) & 0xffffffff00000020);
      local_48 = (double *)(CONCAT44(local_48._4_4_,uVar6) & 0xffffffff00000020);
      do {
        lVar14 = (long)(((iVar4 + iVar19) % iVar3 + iVar3) % iVar3) * (long)iVar18;
        dVar1 = *(double *)((long)pdVar16 + lVar14);
        dVar24 = *(double *)((long)pdVar17 + lVar14);
        if ((uVar6 >> 10 & 1) == 0) {
          if ((ulong)ABS(dVar1) < 0x7ff0000000000000) {
LAB_001e4670:
            if ((0.0 < dVar1) || ((int)local_48 == 0)) {
              dVar10 = (pIVar15->ExtentsX).Min;
              dVar11 = (pIVar15->ExtentsX).Max;
              uVar20 = -(ulong)(dVar1 < dVar10);
              uVar21 = -(ulong)(dVar11 < dVar1);
              auVar26._0_8_ = (ulong)dVar1 & uVar20;
              auVar26._8_8_ = (ulong)dVar1 & uVar21;
              auVar28._0_8_ = ~uVar20 & (ulong)dVar10;
              auVar28._8_8_ = ~uVar21 & (ulong)dVar11;
              pIVar15->ExtentsX = (ImPlotRange)(auVar28 | auVar26);
            }
          }
        }
        else if ((((ulong)ABS(dVar1) < 0x7ff0000000000000) &&
                 (pIVar8->YAxis[iVar5].Range.Min <= dVar24)) &&
                (dVar24 <= pIVar8->YAxis[iVar5].Range.Max)) goto LAB_001e4670;
        if ((uVar7 >> 10 & 1) == 0) {
          if ((ulong)ABS(dVar24) < 0x7ff0000000000000) {
LAB_001e46f0:
            if ((0.0 < dVar24) || ((int)local_80 == 0)) {
              dVar1 = pIVar12[iVar5].Min;
              dVar10 = pIVar15->ExtentsY[iVar5].Max;
              uVar21 = -(ulong)(dVar24 < dVar1);
              uVar22 = -(ulong)(dVar10 < dVar24);
              uVar20 = (ulong)dVar24 & uVar22;
              auVar27._0_8_ = ~uVar21 & (ulong)dVar1;
              auVar27._8_8_ = ~uVar22 & (ulong)dVar10;
              auVar9._8_4_ = (int)uVar20;
              auVar9._0_8_ = (ulong)dVar24 & uVar21;
              auVar9._12_4_ = (int)(uVar20 >> 0x20);
              pIVar12[iVar5] = (ImPlotRange)(auVar27 | auVar9);
            }
          }
        }
        else if ((((ulong)ABS(dVar24) < 0x7ff0000000000000) && ((pIVar8->XAxis).Range.Min <= dVar1))
                && (dVar1 <= (pIVar8->XAxis).Range.Max)) goto LAB_001e46f0;
        iVar19 = iVar19 + 1;
      } while (iVar3 != iVar19);
    }
    local_90 = GetPlotDrawList();
    if ((1 < getter->Count) && ((pIVar15->NextItemData).RenderLine == true)) {
      col = ImGui::GetColorU32((pIVar15->NextItemData).Colors);
      iVar3 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar3]) {
      case 0:
        local_a0 = CONCAT44(local_a0._4_4_,iVar3);
        RenderStairs<ImPlot::GetterXsYs<double>,ImPlot::TransformerLinLin>
                  (getter,(TransformerLinLin *)&local_a0,local_90,(pIVar15->NextItemData).LineWeight
                   ,col);
        break;
      case 1:
        local_a0 = CONCAT44(local_a0._4_4_,iVar3);
        RenderStairs<ImPlot::GetterXsYs<double>,ImPlot::TransformerLogLin>
                  (getter,(TransformerLogLin *)&local_a0,local_90,(pIVar15->NextItemData).LineWeight
                   ,col);
        break;
      case 2:
        local_a0 = CONCAT44(local_a0._4_4_,iVar3);
        RenderStairs<ImPlot::GetterXsYs<double>,ImPlot::TransformerLinLog>
                  (getter,(TransformerLinLog *)&local_a0,local_90,(pIVar15->NextItemData).LineWeight
                   ,col);
        break;
      case 3:
        local_a0 = CONCAT44(local_a0._4_4_,iVar3);
        RenderStairs<ImPlot::GetterXsYs<double>,ImPlot::TransformerLogLog>
                  (getter,(TransformerLogLog *)&local_a0,local_90,(pIVar15->NextItemData).LineWeight
                   ,col);
      }
    }
    if ((pIVar15->NextItemData).Marker != -1) {
      PopPlotClipRect();
      PushPlotClipRect((pIVar15->NextItemData).MarkerSize);
      local_94 = ImGui::GetColorU32((pIVar15->NextItemData).Colors + 2);
      local_98 = ImGui::GetColorU32((pIVar15->NextItemData).Colors + 3);
      transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
      local_80 = GImPlot;
      switch(GImPlot->Scales[transformer.YAxis]) {
      case 0:
        iVar3 = getter->Count;
        if (0 < iVar3) {
          pdVar16 = getter->Xs;
          pdVar17 = getter->Ys;
          uVar20 = (ulong)(uint)getter->Offset;
          local_58 = (double *)CONCAT44(local_58._4_4_,(pIVar15->NextItemData).MarkerSize);
          local_60 = CONCAT44(local_60._4_4_,(pIVar15->NextItemData).MarkerWeight);
          local_68 = (ulong)(pIVar15->NextItemData).Marker;
          iVar4 = getter->Stride;
          iVar18 = 0;
          bVar13 = (pIVar15->NextItemData).RenderMarkerLine;
          local_78 = CONCAT44(local_78._4_4_,(uint)(pIVar15->NextItemData).RenderMarkerFill);
          pIVar15 = GImPlot;
          local_70 = uVar20;
          local_50 = pdVar16;
          local_48 = pdVar17;
          do {
            lVar14 = (long)((((int)uVar20 + iVar18) % iVar3 + iVar3) % iVar3) * (long)iVar4;
            IVar2 = pIVar15->PixelRange[transformer.YAxis].Min;
            fVar23 = (float)(pIVar15->Mx *
                             (*(double *)((long)pdVar16 + lVar14) -
                             (pIVar15->CurrentPlot->XAxis).Range.Min) + (double)IVar2.x);
            fVar25 = (float)(pIVar15->My[transformer.YAxis] *
                             (*(double *)((long)pdVar17 + lVar14) -
                             pIVar15->CurrentPlot->YAxis[transformer.YAxis].Range.Min) +
                            (double)IVar2.y);
            local_a0 = CONCAT44(fVar25,fVar23);
            pIVar8 = local_80->CurrentPlot;
            if ((((pIVar8->PlotRect).Min.x <= fVar23) && ((pIVar8->PlotRect).Min.y <= fVar25)) &&
               ((fVar23 < (pIVar8->PlotRect).Max.x && (fVar25 < (pIVar8->PlotRect).Max.y)))) {
              (**(code **)(RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterXsYs<double>>(ImPlot::GetterXsYs<double>,ImPlot::TransformerLinLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                           ::marker_table + local_68 * 8))
                        ((ulong)local_58 & 0xffffffff,(undefined4)local_60,local_90,&local_a0,bVar13
                         ,local_94,local_78 & 0xffffffff,local_98);
              pIVar15 = GImPlot;
              pdVar16 = local_50;
              pdVar17 = local_48;
              uVar20 = local_70;
            }
            iVar18 = iVar18 + 1;
          } while (iVar3 != iVar18);
        }
        break;
      case 1:
        iVar3 = getter->Count;
        if (0 < iVar3) {
          local_50 = getter->Xs;
          local_58 = getter->Ys;
          local_60 = (ulong)(uint)getter->Offset;
          local_68 = CONCAT44(local_68._4_4_,(pIVar15->NextItemData).MarkerSize);
          local_70 = CONCAT44(local_70._4_4_,(pIVar15->NextItemData).MarkerWeight);
          local_78 = (ulong)(pIVar15->NextItemData).Marker;
          iVar4 = getter->Stride;
          iVar18 = 0;
          local_84 = (uint)(pIVar15->NextItemData).RenderMarkerLine;
          local_88 = (uint)(pIVar15->NextItemData).RenderMarkerFill;
          do {
            pIVar15 = GImPlot;
            lVar14 = (long)((((int)local_60 + iVar18) % iVar3 + iVar3) % iVar3) * (long)iVar4;
            local_48 = *(double **)((long)local_58 + lVar14);
            uStack_40 = 0;
            dVar24 = log10(*(double *)((long)local_50 + lVar14) /
                           (GImPlot->CurrentPlot->XAxis).Range.Min);
            pIVar8 = pIVar15->CurrentPlot;
            dVar1 = (pIVar8->XAxis).Range.Min;
            IVar2 = pIVar15->PixelRange[transformer.YAxis].Min;
            fVar23 = (float)(pIVar15->Mx *
                             (((double)(float)(dVar24 / pIVar15->LogDenX) *
                               ((pIVar8->XAxis).Range.Max - dVar1) + dVar1) - dVar1) +
                            (double)IVar2.x);
            fVar25 = (float)(pIVar15->My[transformer.YAxis] *
                             ((double)local_48 - pIVar8->YAxis[transformer.YAxis].Range.Min) +
                            (double)IVar2.y);
            local_a0 = CONCAT44(fVar25,fVar23);
            pIVar8 = local_80->CurrentPlot;
            if ((((pIVar8->PlotRect).Min.x <= fVar23) && ((pIVar8->PlotRect).Min.y <= fVar25)) &&
               ((fVar23 < (pIVar8->PlotRect).Max.x && (fVar25 < (pIVar8->PlotRect).Max.y)))) {
              (**(code **)(RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterXsYs<double>>(ImPlot::GetterXsYs<double>,ImPlot::TransformerLogLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                           ::marker_table + local_78 * 8))
                        (local_68 & 0xffffffff,(undefined4)local_70,local_90,&local_a0,local_84,
                         local_94,local_88,local_98);
            }
            iVar18 = iVar18 + 1;
          } while (iVar3 != iVar18);
        }
        break;
      case 2:
        iVar3 = getter->Count;
        if (0 < iVar3) {
          local_50 = getter->Xs;
          local_58 = getter->Ys;
          local_60 = (ulong)(uint)getter->Offset;
          local_68 = CONCAT44(local_68._4_4_,(pIVar15->NextItemData).MarkerSize);
          local_70 = CONCAT44(local_70._4_4_,(pIVar15->NextItemData).MarkerWeight);
          local_78 = (ulong)(pIVar15->NextItemData).Marker;
          iVar4 = getter->Stride;
          iVar18 = 0;
          local_84 = (uint)(pIVar15->NextItemData).RenderMarkerLine;
          local_88 = (uint)(pIVar15->NextItemData).RenderMarkerFill;
          do {
            pIVar15 = GImPlot;
            lVar14 = (long)((((int)local_60 + iVar18) % iVar3 + iVar3) % iVar3) * (long)iVar4;
            local_48 = *(double **)((long)local_50 + lVar14);
            uStack_40 = 0;
            dVar24 = log10(*(double *)((long)local_58 + lVar14) /
                           GImPlot->CurrentPlot->YAxis[transformer.YAxis].Range.Min);
            pIVar8 = pIVar15->CurrentPlot;
            dVar1 = pIVar8->YAxis[transformer.YAxis].Range.Min;
            IVar2 = pIVar15->PixelRange[transformer.YAxis].Min;
            fVar23 = (float)(pIVar15->Mx * ((double)local_48 - (pIVar8->XAxis).Range.Min) +
                            (double)IVar2.x);
            fVar25 = (float)(pIVar15->My[transformer.YAxis] *
                             (((double)(float)(dVar24 / pIVar15->LogDenY[transformer.YAxis]) *
                               (pIVar8->YAxis[transformer.YAxis].Range.Max - dVar1) + dVar1) - dVar1
                             ) + (double)IVar2.y);
            local_a0 = CONCAT44(fVar25,fVar23);
            pIVar8 = local_80->CurrentPlot;
            if (((((pIVar8->PlotRect).Min.x <= fVar23) && ((pIVar8->PlotRect).Min.y <= fVar25)) &&
                (fVar23 < (pIVar8->PlotRect).Max.x)) && (fVar25 < (pIVar8->PlotRect).Max.y)) {
              (**(code **)(RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterXsYs<double>>(ImPlot::GetterXsYs<double>,ImPlot::TransformerLinLog,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                           ::marker_table + local_78 * 8))
                        (local_68 & 0xffffffff,(undefined4)local_70,local_90,&local_a0,local_84,
                         local_94,local_88,local_98);
            }
            iVar18 = iVar18 + 1;
          } while (iVar3 != iVar18);
        }
        break;
      case 3:
        RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterXsYs<double>>
                  (*getter,transformer,local_90,(pIVar15->NextItemData).Marker,
                   (pIVar15->NextItemData).MarkerSize,(pIVar15->NextItemData).RenderMarkerLine,
                   local_94,(pIVar15->NextItemData).MarkerWeight,
                   (pIVar15->NextItemData).RenderMarkerFill,local_98);
      }
    }
    pIVar15 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar15->NextItemData);
    pIVar15->PreviousItem = pIVar15->CurrentItem;
    pIVar15->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotStairsEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(p);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        if (getter.Count > 1 && s.RenderLine) {
            const ImU32 col_line    = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderStairs(getter, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderStairs(getter, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderStairs(getter, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderStairs(getter, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        // render markers
        if (s.Marker != ImPlotMarker_None) {
            PopPlotClipRect();
            PushPlotClipRect(s.MarkerSize);
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(getter, TransformerLinLin(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(getter, TransformerLogLin(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(getter, TransformerLinLog(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(getter, TransformerLogLog(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}